

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbQueue.h
# Opt level: O2

void __thiscall Hpipe::CbQueue::new_buff(CbQueue *this,PT size)

{
  Buffer *pBVar1;
  
  if (this->beg != (Buffer *)0x0) {
    pBVar1 = Buffer::New(size,this->end);
    this->end = pBVar1;
    return;
  }
  init_beg(this);
  return;
}

Assistant:

void new_buff( PT size = Buffer::default_size ) { if ( not beg ) init_beg(); else end = Buffer::New( size, end ); }